

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SplitLayerParams::CopyFrom(SplitLayerParams *this,SplitLayerParams *from)

{
  if (from != this) {
    this->noutputs_ = 0;
    if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
                (&(this->super_MessageLite)._internal_metadata_);
    }
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void SplitLayerParams::CopyFrom(const SplitLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.SplitLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}